

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

void __thiscall
pbrt::syntactic::BasicLexer<pbrt::syntactic::MappedFile>::CharBuffer::operator<<
          (CharBuffer *this,char c)

{
  value_type local_1;
  
  std::vector<char,_std::allocator<char>_>::push_back(&this->data_,&local_1);
  return;
}

Assistant:

void operator<<(char c) { data_.push_back(c); }